

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::ColorSpace(ParsedScene *this,string *name,FileLoc loc)

{
  RGBColorSpace *pRVar1;
  
  pRVar1 = RGBColorSpace::GetNamed(name);
  if (pRVar1 == (RGBColorSpace *)0x0) {
    Error<std::__cxx11::string_const&>(&loc,"%s: color space unknown",name);
  }
  else {
    (this->graphicsState).colorSpace = pRVar1;
  }
  return;
}

Assistant:

void ParsedScene::ColorSpace(const std::string &name, FileLoc loc) {
    if (const RGBColorSpace *cs = RGBColorSpace::GetNamed(name))
        graphicsState.colorSpace = cs;
    else
        Error(&loc, "%s: color space unknown", name);
}